

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall QSocks5BindStore::timerEvent(QSocks5BindStore *this,QTimerEvent *event)

{
  Span *pSVar1;
  char cVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  piter local_38;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &this->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QRecursiveMutex::lock((QRecursiveMutex *)local_28._0_8_);
  local_28[8] = true;
  if (*(TimerId *)(event + 0x10) == (this->sweepTimer).m_id) {
    local_38 = (piter)QHash<long_long,_QSocks5BindData_*>::begin(&this->store);
    while( true ) {
      if (local_38.d == (Data<QHashPrivate::Node<long_long,_QSocks5BindData_*>_> *)0x0 &&
          local_38.bucket == 0) break;
      pSVar1 = (local_38.d)->spans;
      uVar3 = local_38.bucket >> 7;
      cVar2 = QElapsedTimer::hasExpired
                        (*(long *)(pSVar1[uVar3].entries
                                   [pSVar1[uVar3].offsets[(uint)local_38.bucket & 0x7f]].storage.
                                   data + 8) + 0x30);
      if (cVar2 == '\0') {
        QHashPrivate::iterator<QHashPrivate::Node<long_long,_QSocks5BindData_*>_>::operator++
                  (&local_38);
      }
      else {
        local_38 = (piter)QHash<long_long,_QSocks5BindData_*>::erase
                                    (&this->store,(const_iterator)local_38);
      }
    }
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5BindStore::timerEvent(QTimerEvent * event)
{
    QMutexLocker lock(&mutex);
    if (event->id() == sweepTimer.id()) {
        QSOCKS5_DEBUG << "QSocks5BindStore performing sweep";
        for (auto it = store.begin(), end = store.end(); it != end;) {
            if (it.value()->timeStamp.hasExpired(350000)) {
                QSOCKS5_DEBUG << "QSocks5BindStore removing JJJJ";
                it = store.erase(it);
            } else {
                ++it;
            }
        }
    }
}